

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

void __thiscall Entity::rotateCounterClockwise(Entity *this)

{
  string *psVar1;
  ostream *this_00;
  int local_1c;
  Entity *this_local;
  
  if (this->rotation < 1) {
    local_1c = 0x10e;
  }
  else {
    local_1c = this->rotation + -0x5a;
  }
  this->rotation = local_1c;
  psVar1 = (string *)(**(code **)(*(long *)this + 0x40))();
  this_00 = std::operator<<((ostream *)&std::cout,psVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Entity::rotateCounterClockwise() {
    rotation = rotation > 0 ? (rotation - 90) : 270;
    cout << *toString() << endl;
}